

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  Particle<(pica::Dimension)3> a;
  Particle<(pica::Dimension)3> a_00;
  Particle<(pica::Dimension)3> b;
  Particle<(pica::Dimension)3> b_00;
  bool bVar1;
  ParticleRef pPVar2;
  undefined8 in_RDI;
  AssertionResult gtest_ar__1;
  ParticleArray particlesCopy;
  AssertionResult gtest_ar_;
  ParticleType particle;
  int i;
  ParticleArray particles;
  ConstParticleRef in_stack_fffffffffffffd08;
  ConstParticleRef pPVar3;
  String *in_stack_fffffffffffffd10;
  String *this_00;
  char *pcVar4;
  undefined8 uVar5;
  int iVar6;
  char *pcVar7;
  undefined8 uVar8;
  Type TVar9;
  AssertHelper *pAVar10;
  Message *pMVar11;
  AssertHelper *pAVar12;
  char *pcVar13;
  char *pcVar14;
  AssertionResult *pAVar15;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffd90;
  undefined1 *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  ConstParticleRef in_stack_fffffffffffffdb0;
  undefined1 *puVar16;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  String in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffde8 [16];
  double in_stack_fffffffffffffdf8;
  double in_stack_fffffffffffffe00;
  double in_stack_fffffffffffffe08;
  Message *in_stack_fffffffffffffe10;
  AssertHelper *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  AssertionResult local_170 [2];
  String local_148 [2];
  double local_128;
  double dStack_120;
  double local_118;
  Message *pMStack_110;
  AssertHelper *local_108;
  char *pcStack_100;
  char *local_f8;
  AssertionResult *pAStack_f0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *local_e8;
  ConstParticleRef local_d8;
  String *pSStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  AssertHelper *pAStack_a0;
  undefined8 local_98;
  AssertionResult local_90 [2];
  ConstParticleRef local_70;
  String *pSStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  char *pcStack_48;
  undefined8 local_40;
  AssertHelper *pAStack_38;
  undefined8 local_30;
  int local_24;
  
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)0x21f81c);
  for (local_24 = 0; local_24 < 0xd; local_24 = local_24 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (in_stack_fffffffffffffd90);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::pushBack
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd08);
    local_98 = local_30;
    local_a8 = local_40;
    pAStack_a0 = pAStack_38;
    local_b8 = local_50;
    pcStack_b0 = pcStack_48;
    local_c8 = local_60;
    pcStack_c0 = pcStack_58;
    local_d8 = local_70;
    pSStack_d0 = pSStack_68;
    pPVar2 = pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::back
                       ((ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)0x21f8c0);
    local_e8 = *(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> **)&pPVar2->typeIndex;
    local_128 = (pPVar2->position).x;
    dStack_120 = (pPVar2->position).y;
    local_118 = (pPVar2->position).z;
    pMVar11 = (Message *)(pPVar2->p).x;
    pAVar12 = (AssertHelper *)(pPVar2->p).y;
    pcVar13 = (char *)(pPVar2->p).z;
    pcVar14 = (char *)pPVar2->factor;
    pAVar15 = (AssertionResult *)pPVar2->invGamma;
    a.position.y._0_7_ = in_stack_fffffffffffffda8;
    a.position.x = (double)in_stack_fffffffffffffda0;
    a.position.y._7_1_ = in_stack_fffffffffffffdaf;
    a.position.z = (double)in_stack_fffffffffffffdb0;
    a.p.x = (double)&stack0xfffffffffffffd08;
    a.p.y._0_7_ = in_stack_fffffffffffffdc0;
    a.p.y._7_1_ = in_stack_fffffffffffffdc7;
    a.p.z = (double)pPVar2;
    a.factor = (FactorType)in_RDI;
    a._56_16_ = in_stack_fffffffffffffdd8;
    b.position.z = in_stack_fffffffffffffdf8;
    b.position.x = (double)in_stack_fffffffffffffde8._0_8_;
    b.position.y = (double)in_stack_fffffffffffffde8._8_8_;
    b.p.x = in_stack_fffffffffffffe00;
    b.p.y = in_stack_fffffffffffffe08;
    b.p.z = (double)in_stack_fffffffffffffe10;
    b.factor = (FactorType)in_stack_fffffffffffffe18;
    b.invGamma = (GammaType)in_stack_fffffffffffffe20;
    b._64_8_ = in_stack_fffffffffffffe28;
    pPVar3 = local_d8;
    this_00 = pSStack_d0;
    pcVar4 = pcStack_c0;
    uVar5 = local_b8;
    pcVar7 = pcStack_b0;
    uVar8 = local_a8;
    pAVar10 = pAStack_a0;
    puVar16 = &stack0xfffffffffffffd08;
    pMStack_110 = pMVar11;
    local_108 = pAVar12;
    pcStack_100 = pcVar13;
    local_f8 = pcVar14;
    pAStack_f0 = pAVar15;
    in_stack_fffffffffffffdc7 =
         BaseParticleFixture<pica::Particle<(pica::Dimension)3>>::
         eqParticles_<pica::Particle<(pica::Dimension)3>,pica::Particle<(pica::Dimension)3>>
                   (local_e8,a,b);
    TVar9 = (Type)((ulong)uVar8 >> 0x20);
    iVar6 = (int)((ulong)uVar5 >> 0x20);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)this_00,SUB81((ulong)pPVar3 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_90);
    if (!bVar1) {
      testing::Message::Message((Message *)pAVar10);
      testing::internal::GetBoolAssertionFailureMessage(pAVar15,pcVar14,pcVar13,(char *)pAVar12);
      testing::internal::String::c_str(local_148);
      testing::internal::AssertHelper::AssertHelper(pAVar10,TVar9,pcVar7,iVar6,pcVar4);
      testing::internal::AssertHelper::operator=(pAVar12,pMVar11);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::String::~String(this_00);
      testing::Message::~Message((Message *)0x21fa9e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x21fb35);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::ParticleArrayAoS
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)this_00,
               (ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)pPVar3);
    pAVar10 = pAStack_38;
    uVar8 = local_40;
    pcVar7 = pcStack_48;
    uVar5 = local_50;
    pcVar4 = pcStack_58;
    in_stack_fffffffffffffd10 = pSStack_68;
    in_stack_fffffffffffffd08 = local_70;
    in_stack_fffffffffffffdb0 =
         pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::back
                   ((ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)0x21fba9);
    in_stack_fffffffffffffd90 =
         *(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> **)
          &in_stack_fffffffffffffdb0->typeIndex;
    in_stack_fffffffffffffdf8 = (in_stack_fffffffffffffdb0->position).x;
    in_stack_fffffffffffffe00 = (in_stack_fffffffffffffdb0->position).y;
    in_stack_fffffffffffffe08 = (in_stack_fffffffffffffdb0->position).z;
    pMVar11 = (Message *)(in_stack_fffffffffffffdb0->p).x;
    pAVar12 = (AssertHelper *)(in_stack_fffffffffffffdb0->p).y;
    pcVar13 = (char *)(in_stack_fffffffffffffdb0->p).z;
    pcVar14 = (char *)in_stack_fffffffffffffdb0->factor;
    pAVar15 = (AssertionResult *)in_stack_fffffffffffffdb0->invGamma;
    a_00.position.y._0_7_ = in_stack_fffffffffffffda8;
    a_00.position.x = (double)&stack0xfffffffffffffd08;
    a_00.position.y._7_1_ = in_stack_fffffffffffffdaf;
    a_00.position.z = (double)in_stack_fffffffffffffdb0;
    a_00.p.x = (double)puVar16;
    a_00.p.y._0_7_ = in_stack_fffffffffffffdc0;
    a_00.p.y._7_1_ = in_stack_fffffffffffffdc7;
    a_00.p.z = (double)pPVar2;
    a_00.factor = (FactorType)in_RDI;
    a_00._56_16_ = in_stack_fffffffffffffdd8;
    b_00.position.z = in_stack_fffffffffffffdf8;
    b_00.position.x = (double)in_stack_fffffffffffffde8._0_8_;
    b_00.position.y = (double)in_stack_fffffffffffffde8._8_8_;
    b_00.p.x = in_stack_fffffffffffffe00;
    b_00.p.y = in_stack_fffffffffffffe08;
    b_00.p.z = (double)pMVar11;
    b_00.factor = (FactorType)pAVar12;
    b_00.invGamma = (GammaType)pcVar13;
    b_00._64_8_ = pcVar14;
    in_stack_fffffffffffffda0 = &stack0xfffffffffffffd08;
    in_stack_fffffffffffffe10 = pMVar11;
    in_stack_fffffffffffffe18 = pAVar12;
    in_stack_fffffffffffffe20 = pcVar13;
    in_stack_fffffffffffffe28 = pcVar14;
    in_stack_fffffffffffffdaf =
         BaseParticleFixture<pica::Particle<(pica::Dimension)3>>::
         eqParticles_<pica::Particle<(pica::Dimension)3>,pica::Particle<(pica::Dimension)3>>
                   (in_stack_fffffffffffffd90,a_00,b_00);
    TVar9 = (Type)((ulong)uVar8 >> 0x20);
    iVar6 = (int)((ulong)uVar5 >> 0x20);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffd10,
               SUB81((ulong)in_stack_fffffffffffffd08 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
    if (!bVar1) {
      testing::Message::Message((Message *)pAVar10);
      testing::internal::GetBoolAssertionFailureMessage(pAVar15,pcVar14,pcVar13,(char *)pAVar12);
      testing::internal::String::c_str((String *)&stack0xfffffffffffffdd8);
      testing::internal::AssertHelper::AssertHelper(pAVar10,TVar9,pcVar7,iVar6,pcVar4);
      testing::internal::AssertHelper::operator=(pAVar12,pMVar11);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
      testing::internal::String::~String(in_stack_fffffffffffffd10);
      testing::Message::~Message((Message *)0x21fd99);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x21fe2d);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::~ParticleArrayAoS
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)0x21fe3a);
  }
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>::~ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_> *)0x21fe79);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}